

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,size_t insertion_offset,size_t insertion_length)

{
  GeneratorContextImpl *pGVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  long lVar8;
  _Base_ptr data;
  GeneratedCodeInfo metadata;
  GeneratedCodeInfo local_60;
  
  pGVar1 = this->directory_;
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  local_60.super_Message.super_MessageLite._vptr_MessageLite =
       (MessageLite)(MessageLite)&local_60._has_bits_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (this->filename_)._M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(pGVar1->files_)._M_t,(key_type *)&local_60);
  if (local_60.super_Message.super_MessageLite._vptr_MessageLite !=
      (MessageLite)&local_60._has_bits_) {
    operator_delete((void *)local_60.super_Message.super_MessageLite._vptr_MessageLite);
  }
  if ((_Rb_tree_header *)iVar6._M_node !=
      &(this->directory_->files_)._M_t._M_impl.super__Rb_tree_header) {
    data = iVar6._M_node + 2;
    GeneratedCodeInfo::GeneratedCodeInfo(&local_60);
    bVar4 = MessageLite::ParseFromString((MessageLite *)&local_60,(string *)data);
    if ((bVar4) ||
       (bVar5 = TextFormat::ParseFromString((string *)data,&local_60.super_Message), bVar5)) {
      if (0 < local_60.annotation_.super_RepeatedPtrFieldBase.current_size_) {
        lVar8 = 0;
        do {
          pvVar3 = (local_60.annotation_.super_RepeatedPtrFieldBase.rep_)->elements[lVar8];
          if (insertion_offset <= (ulong)(long)*(int *)((long)pvVar3 + 0x38)) {
            *(int *)((long)pvVar3 + 0x38) = *(int *)((long)pvVar3 + 0x38) + (int)insertion_length;
            *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 6;
            *(int *)((long)pvVar3 + 0x3c) = *(int *)((long)pvVar3 + 0x3c) + (int)insertion_length;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_60.annotation_.super_RepeatedPtrFieldBase.current_size_);
      }
      if (bVar4) {
        MessageLite::SerializeToString((MessageLite *)&local_60,(string *)data);
      }
      else {
        TextFormat::PrintToString(&local_60.super_Message,(string *)data);
      }
    }
    else {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,".meta: Could not parse metadata as wire or text format.",0x37);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    GeneratedCodeInfo::~GeneratedCodeInfo(&local_60);
    return;
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    size_t insertion_offset, size_t insertion_length) {
  auto it = directory_->files_.find(filename_ + ".meta");
  if (it == directory_->files_.end()) {
    // No metadata was recorded for this file.
    return;
  }
  std::string& encoded_data = it->second;
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  if (!metadata.ParseFromString(encoded_data)) {
    if (!TextFormat::ParseFromString(encoded_data, &metadata)) {
      // The metadata is invalid.
      std::cerr << filename_
                << ".meta: Could not parse metadata as wire or text format."
                << std::endl;
      return;
    }
    // Generators that use the public plugin interface emit text-format
    // metadata (because in the public plugin protocol, file content must be
    // UTF8-encoded strings).
    is_text_format = true;
  }
  for (int i = 0; i < metadata.annotation_size(); ++i) {
    GeneratedCodeInfo::Annotation* annotation = metadata.mutable_annotation(i);
    if (annotation->begin() >= insertion_offset) {
      annotation->set_begin(annotation->begin() + insertion_length);
      annotation->set_end(annotation->end() + insertion_length);
    }
  }
  if (is_text_format) {
    TextFormat::PrintToString(metadata, &encoded_data);
  } else {
    metadata.SerializeToString(&encoded_data);
  }
}